

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code
createUniqueEntity(Twine *Model,int *ResultFD,SmallVectorImpl<char> *ResultPath,bool MakeAbsolute,
                  uint Mode,FSEntity Type,OpenFlags Flags)

{
  error_category eVar1;
  bool bVar2;
  uint uVar3;
  perms Perms;
  size_t sVar4;
  ulong uVar5;
  error_category *peVar6;
  error_category *peVar7;
  undefined8 extraout_RDX;
  error_code eVar8;
  error_code local_2c0;
  Twine local_2b0;
  error_code local_298;
  Twine local_288;
  undefined1 local_270 [8];
  error_code EC_1;
  error_code local_258;
  Twine local_248;
  uint local_22c;
  uint local_228;
  uint e;
  uint i;
  Twine local_208;
  Twine local_1f0;
  Twine local_1d8;
  undefined1 local_1c0 [8];
  SmallString<128U> TDir;
  undefined1 local_118 [8];
  SmallString<128U> ModelStorage;
  FSEntity Type_local;
  uint Mode_local;
  bool MakeAbsolute_local;
  SmallVectorImpl<char> *ResultPath_local;
  int *ResultFD_local;
  Twine *Model_local;
  error_code EC;
  
  ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._124_4_
       = Type;
  llvm::SmallString<128U>::SmallString((SmallString<128U> *)local_118);
  llvm::Twine::toVector(Model,(SmallVectorImpl<char> *)local_118);
  if (MakeAbsolute) {
    llvm::Twine::Twine((Twine *)(TDir.super_SmallVector<char,_128U>.
                                 super_SmallVectorStorage<char,_128U>.InlineElts + 0x78),
                       (SmallVectorImpl<char> *)local_118);
    bVar2 = llvm::sys::path::is_absolute
                      ((Twine *)(TDir.super_SmallVector<char,_128U>.
                                 super_SmallVectorStorage<char,_128U>.InlineElts + 0x78),native);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      llvm::SmallString<128U>::SmallString((SmallString<128U> *)local_1c0);
      llvm::sys::path::system_temp_directory(true,(SmallVectorImpl<char> *)local_1c0);
      llvm::Twine::Twine(&local_1d8,(SmallVectorImpl<char> *)local_118);
      llvm::Twine::Twine(&local_1f0,"");
      llvm::Twine::Twine(&local_208,"");
      llvm::Twine::Twine((Twine *)&i,"");
      llvm::sys::path::append
                ((SmallVectorImpl<char> *)local_1c0,&local_1d8,&local_1f0,&local_208,(Twine *)&i);
      llvm::SmallVectorImpl<char>::swap
                ((SmallVectorImpl<char> *)local_118,(SmallVectorImpl<char> *)local_1c0);
      llvm::SmallString<128U>::~SmallString((SmallString<128U> *)local_1c0);
    }
  }
  llvm::SmallVectorImpl<char>::operator=(ResultPath,(SmallVectorImpl<char> *)local_118);
  e._3_1_ = 0;
  llvm::SmallVectorTemplateBase<char,_true>::push_back
            (&ResultPath->super_SmallVectorTemplateBase<char,_true>,(char *)((long)&e + 3));
  llvm::SmallVectorTemplateBase<char,_true>::pop_back
            (&ResultPath->super_SmallVectorTemplateBase<char,_true>);
  do {
    while( true ) {
      local_228 = 0;
      sVar4 = llvm::SmallVectorBase::size((SmallVectorBase *)local_118);
      local_22c = (uint)sVar4;
      for (; local_228 != local_22c; local_228 = local_228 + 1) {
        uVar5 = (ulong)local_228;
        sVar4 = llvm::SmallVectorBase::size((SmallVectorBase *)local_118);
        if (sVar4 <= uVar5) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                       );
        }
        if (*(char *)((long)local_118 + uVar5) == '%') {
          uVar3 = llvm::sys::Process::GetRandomNumber();
          eVar1 = *(error_category *)("0123456789abcdef" + (uVar3 & 0xf));
          peVar6 = (error_category *)(ulong)local_228;
          EC._M_cat = peVar6;
          peVar7 = (error_category *)llvm::SmallVectorBase::size((SmallVectorBase *)ResultPath);
          if (peVar7 <= peVar6) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                         );
          }
          EC._M_cat[(long)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX]
               = eVar1;
        }
      }
      if (ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts
          ._124_4_ == 0) break;
      if (ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts
          ._124_4_ == 1) {
        llvm::Twine::Twine(&local_248,
                           (char *)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX);
        eVar8 = llvm::sys::fs::openFileForReadWrite(&local_248,ResultFD,CD_CreateNew,Flags,Mode);
        EC._0_8_ = eVar8._M_cat;
        Model_local = (Twine *)CONCAT44(Model_local._4_4_,eVar8._M_value);
        bVar2 = std::error_code::operator_cast_to_bool((error_code *)&Model_local);
        if (!bVar2) {
          std::error_code::error_code((error_code *)&Model_local);
          goto LAB_001f47c8;
        }
        std::error_code::error_code<llvm::errc,void>(&local_258,file_exists);
        bVar2 = std::operator==((error_code *)&Model_local,&local_258);
        if (!bVar2) goto LAB_001f47c8;
      }
      else {
        if (ModelStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
            InlineElts._124_4_ != 2) {
          llvm::llvm_unreachable_internal
                    ("Invalid Type",
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                     ,0xea);
        }
        llvm::Twine::Twine(&local_288,
                           (char *)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .BeginX);
        local_270._0_4_ = llvm::sys::fs::access((char *)&local_288,0);
        EC_1._0_8_ = extraout_RDX;
        std::error_code::error_code<llvm::errc,void>(&local_298,no_such_file_or_directory);
        bVar2 = std::operator==((error_code *)local_270,&local_298);
        if (bVar2) {
          std::error_code::error_code((error_code *)&Model_local);
          goto LAB_001f47c8;
        }
        bVar2 = std::error_code::operator_cast_to_bool((error_code *)local_270);
        if (bVar2) {
          Model_local = (Twine *)CONCAT44(local_270._4_4_,local_270._0_4_);
          EC._M_value = EC_1._M_value;
          EC._4_4_ = EC_1._4_4_;
          goto LAB_001f47c8;
        }
      }
    }
    llvm::Twine::Twine(&local_2b0,
                       (char *)(ResultPath->super_SmallVectorTemplateBase<char,_true>).
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               BeginX);
    Perms = llvm::sys::fs::operator|(owner_all,group_all);
    eVar8 = llvm::sys::fs::create_directory(&local_2b0,false,Perms);
    EC._0_8_ = eVar8._M_cat;
    Model_local = (Twine *)CONCAT44(Model_local._4_4_,eVar8._M_value);
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)&Model_local);
    if (!bVar2) {
      std::error_code::error_code((error_code *)&Model_local);
      break;
    }
    std::error_code::error_code<llvm::errc,void>(&local_2c0,file_exists);
    bVar2 = std::operator==((error_code *)&Model_local,&local_2c0);
  } while (bVar2);
LAB_001f47c8:
  EC_1._M_cat._4_4_ = 1;
  llvm::SmallString<128U>::~SmallString((SmallString<128U> *)local_118);
  eVar8._0_8_ = (ulong)Model_local & 0xffffffff;
  eVar8._M_cat = (error_category *)EC._0_8_;
  return eVar8;
}

Assistant:

static std::error_code
createUniqueEntity(const Twine &Model, int &ResultFD,
                   SmallVectorImpl<char> &ResultPath, bool MakeAbsolute,
                   unsigned Mode, FSEntity Type,
                   sys::fs::OpenFlags Flags = sys::fs::OF_None) {
  SmallString<128> ModelStorage;
  Model.toVector(ModelStorage);

  if (MakeAbsolute) {
    // Make model absolute by prepending a temp directory if it's not already.
    if (!sys::path::is_absolute(Twine(ModelStorage))) {
      SmallString<128> TDir;
      sys::path::system_temp_directory(true, TDir);
      sys::path::append(TDir, Twine(ModelStorage));
      ModelStorage.swap(TDir);
    }
  }

  // From here on, DO NOT modify model. It may be needed if the randomly chosen
  // path already exists.
  ResultPath = ModelStorage;
  // Null terminate.
  ResultPath.push_back(0);
  ResultPath.pop_back();

retry_random_path:
  // Replace '%' with random chars.
  for (unsigned i = 0, e = ModelStorage.size(); i != e; ++i) {
    if (ModelStorage[i] == '%')
      ResultPath[i] = "0123456789abcdef"[sys::Process::GetRandomNumber() & 15];
  }

  // Try to open + create the file.
  switch (Type) {
  case FS_File: {
    if (std::error_code EC =
            sys::fs::openFileForReadWrite(Twine(ResultPath.begin()), ResultFD,
                                          sys::fs::CD_CreateNew, Flags, Mode)) {
      if (EC == errc::file_exists)
        goto retry_random_path;
      return EC;
    }

    return std::error_code();
  }

  case FS_Name: {
    std::error_code EC =
        sys::fs::access(ResultPath.begin(), sys::fs::AccessMode::Exist);
    if (EC == errc::no_such_file_or_directory)
      return std::error_code();
    if (EC)
      return EC;
    goto retry_random_path;
  }

  case FS_Dir: {
    if (std::error_code EC =
            sys::fs::create_directory(ResultPath.begin(), false)) {
      if (EC == errc::file_exists)
        goto retry_random_path;
      return EC;
    }
    return std::error_code();
  }
  }
  llvm_unreachable("Invalid Type");
}